

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.hpp
# Opt level: O3

bool __thiscall
Diligent::DeviceObjectArchive::ResourceData::operator==(ResourceData *this,ResourceData *Other)

{
  bool bVar1;
  SerializedData *Rhs;
  SerializedData *this_00;
  ulong uVar2;
  
  bVar1 = SerializedData::operator==(&this->Common,&Other->Common);
  if (bVar1) {
    this_00 = (SerializedData *)&this->DeviceSpecific;
    Rhs = (SerializedData *)&Other->DeviceSpecific;
    uVar2 = 0xffffffffffffffff;
    do {
      bVar1 = SerializedData::operator==(this_00,Rhs);
      if (!bVar1) goto LAB_0046a122;
      uVar2 = uVar2 + 1;
      this_00 = this_00 + 1;
      Rhs = Rhs + 1;
      bVar1 = 5 < uVar2;
    } while (uVar2 != 6);
  }
  else {
LAB_0046a122:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator==(const ResourceData& Other) const noexcept
        {
            if (Common != Other.Common)
                return false;

            for (size_t i = 0; i < DeviceSpecific.size(); ++i)
            {
                if (DeviceSpecific[i] != Other.DeviceSpecific[i])
                    return false;
            }

            return true;
        }